

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::CharacterFetcher<(TI::TMS::Personality)0>::CharacterFetcher
          (CharacterFetcher<(TI::TMS::Personality)0> *this,Base<(TI::TMS::Personality)0> *base,
          uint8_t y)

{
  ushort uVar1;
  ScreenMode SVar2;
  unsigned_short uVar3;
  ScreenMode mode;
  uint8_t y_local;
  Base<(TI::TMS::Personality)0> *base_local;
  CharacterFetcher<(TI::TMS::Personality)0> *this_local;
  
  this->base = base;
  this->y = y;
  uVar1 = base->pattern_name_address_;
  uVar3 = bits<10,unsigned_short>((y & 0x3ff8) << 2);
  this->row_base = uVar1 & uVar3;
  this->pattern_base = base->pattern_generator_table_address_;
  this->colour_base = base->colour_table_address_;
  this->colour_name_shift = 6;
  SVar2 = base->fetch_line_buffer_->screen_mode;
  if ((SVar2 == Graphics) || (SVar2 == YamahaGraphics3)) {
    uVar3 = bits<13,unsigned_short>((y & 0xc0) << 5);
    this->pattern_base = this->pattern_base & uVar3;
    uVar3 = bits<13,unsigned_short>((y & 0xc0) << 5);
    this->colour_base = this->colour_base & uVar3;
    this->colour_base = this->colour_base + (y & 7);
    this->colour_name_shift = 0;
  }
  else {
    uVar3 = bits<6,unsigned_short>(0);
    this->colour_base = this->colour_base & uVar3;
    uVar3 = bits<11,unsigned_short>(0);
    this->pattern_base = this->pattern_base & uVar3;
  }
  if (SVar2 == MultiColour) {
    this->pattern_base = this->pattern_base + ((ushort)((int)(uint)y >> 2) & 7);
  }
  else {
    this->pattern_base = this->pattern_base + (y & 7);
  }
  return;
}

Assistant:

CharacterFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		y(y),
		row_base(base->pattern_name_address_ & bits<10>(AddressT((y << 2)&~31)))
	{
		pattern_base = base->pattern_generator_table_address_;
		colour_base = base->colour_table_address_;
		colour_name_shift = 6;

		const ScreenMode mode = base->fetch_line_buffer_->screen_mode;
		if(mode == ScreenMode::Graphics || mode == ScreenMode::YamahaGraphics3) {
			// If this is high resolution mode, allow the row number to affect the pattern and colour addresses.
			pattern_base &= bits<13>(AddressT(((y & 0xc0) << 5)));
			colour_base &= bits<13>(AddressT(((y & 0xc0) << 5)));

			colour_base += AddressT(y & 7);
			colour_name_shift = 0;
		} else {
			colour_base &= bits<6, AddressT>();
			pattern_base &= bits<11, AddressT>();
		}

		if(mode == ScreenMode::MultiColour) {
			pattern_base += AddressT((y >> 2) & 7);
		} else {
			pattern_base += AddressT(y & 7);
		}
	}